

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSuite.c
# Opt level: O1

int main(void)

{
  runCBCTests();
  runChunkTests();
  runFileIOTests();
  runSkeinTests();
  runThreefishTests();
  runUtilTests();
  puts("All tests passed :)");
  return 0;
}

Assistant:

int main()
{
    int status = 0;
    #ifdef NDEBUG
        printf("NDEBUG is defined retest with it off");
        status = -1;
    #else
        runCBCTests();
        runChunkTests();
        runFileIOTests();
        runSkeinTests();
        runThreefishTests();
        runUtilTests();
        printf("All tests passed :)\n");
    #endif

    return status;
}